

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereIsCoveringIndexWalkCallback(Walker *pWalk,Expr *pExpr)

{
  short *psVar1;
  int iTab;
  CoveringIndexCheck *pCVar2;
  Index *pIVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int i;
  
  pCVar2 = (pWalk->u).pCovIdxCk;
  pIVar3 = pCVar2->pIdx;
  if ((pExpr->op == 0xa9) || (pExpr->op == 0xa7)) {
    if (pExpr->iTable == pCVar2->iTabCur) {
      uVar5 = 0;
      do {
        if (pIVar3->nColumn == uVar5) {
          pCVar2->bUnidx = '\x01';
          return 2;
        }
        psVar1 = pIVar3->aiColumn + uVar5;
        uVar5 = uVar5 + 1;
      } while (*psVar1 != pExpr->iColumn);
    }
  }
  else if ((pIVar3->field_0x64 & 8) != 0) {
    iTab = pCVar2->iTabCur;
    lVar6 = 4;
    for (uVar5 = 0; uVar5 < pIVar3->nColumn; uVar5 = uVar5 + 1) {
      if ((pIVar3->aiColumn[uVar5] == -2) &&
         (iVar4 = sqlite3ExprCompare((Parse *)0x0,pExpr,
                                     *(Expr **)((long)pIVar3->aColExpr->a + lVar6 * 2 + -8),iTab),
         iVar4 == 0)) {
        pCVar2->bExpr = '\x01';
        return 1;
      }
      lVar6 = lVar6 + 0xc;
    }
  }
  return 0;
}

Assistant:

static int whereIsCoveringIndexWalkCallback(Walker *pWalk, Expr *pExpr){
  int i;                    /* Loop counter */
  const Index *pIdx;        /* The index of interest */
  const i16 *aiColumn;      /* Columns contained in the index */
  u16 nColumn;              /* Number of columns in the index */
  CoveringIndexCheck *pCk;  /* Info about this search */

  pCk = pWalk->u.pCovIdxCk;
  pIdx = pCk->pIdx;
  if( (pExpr->op==TK_COLUMN || pExpr->op==TK_AGG_COLUMN) ){
    /* if( pExpr->iColumn<(BMS-1) && pIdx->bHasExpr==0 ) return WRC_Continue;*/
    if( pExpr->iTable!=pCk->iTabCur ) return WRC_Continue;
    pIdx = pWalk->u.pCovIdxCk->pIdx;
    aiColumn = pIdx->aiColumn;
    nColumn = pIdx->nColumn;
    for(i=0; i<nColumn; i++){
      if( aiColumn[i]==pExpr->iColumn ) return WRC_Continue;
    }
    pCk->bUnidx = 1;
    return WRC_Abort;
  }else if( pIdx->bHasExpr
         && exprIsCoveredByIndex(pExpr, pIdx, pWalk->u.pCovIdxCk->iTabCur) ){
    pCk->bExpr = 1;
    return WRC_Prune;
  }
  return WRC_Continue;
}